

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

MXFWriter * __thiscall
ASDCP::ATMOS::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,AtmosDescriptor *ADesc,
          ui32_t HeaderSize)

{
  AtmosDescriptor *pAVar1;
  int iVar2;
  ILogSink *this_00;
  h__Writer *phVar3;
  Dictionary *d;
  size_type *this_01;
  undefined4 in_register_00000084;
  uint in_R9D;
  undefined1 local_b0 [132];
  ui32_t HeaderSize_local;
  AtmosDescriptor *ADesc_local;
  WriterInfo *Info_local;
  string *filename_local;
  MXFWriter *this_local;
  Result_t *result;
  
  register0x00000080 = (byte_t *)CONCAT44(in_register_00000084,HeaderSize);
  ADesc_local = ADesc;
  Info_local = Info;
  filename_local = filename;
  this_local = this;
  if (*(int *)(ADesc[2].super_DCDataDescriptor.AssetID + 0xc) == 2) {
    local_b0._124_4_ = in_R9D;
    phVar3 = (h__Writer *)operator_new(0x780);
    d = AtmosSMPTEDict();
    h__Writer::h__Writer(phVar3,d);
    this_01 = &filename->_M_string_length;
    mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer>::operator=
              ((mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer> *)this_01,phVar3);
    pAVar1 = ADesc_local;
    phVar3 = mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer>::operator->
                       ((mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer> *)this_01);
    WriterInfo::operator=
              (&(phVar3->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info,
               (WriterInfo *)pAVar1);
    local_b0[0x6b] = 0;
    phVar3 = mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer>::operator->
                       ((mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer> *)this_01);
    h__Writer::OpenWrite
              ((h__Writer *)this,(string *)phVar3,(ui32_t)Info_local,
               (AtmosDescriptor *)(ulong)(uint)local_b0._124_4_);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      phVar3 = mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer>::operator->
                         ((mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer> *)&filename->_M_string_length
                         );
      h__Writer::SetSourceStream
                ((h__Writer *)local_b0,(DCDataDescriptor *)phVar3,stack0xffffffffffffffd0,
                 (string *)ATMOS_ESSENCE_CODING,(string *)ATMOS_PACKAGE_LABEL_abi_cxx11_);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
      Kumu::Result_t::~Result_t((Result_t *)local_b0);
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0) {
      mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer>::release
                ((mem_ptr<ASDCP::ATMOS::MXFWriter::h__Writer> *)&filename->_M_string_length);
    }
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Atmos support requires LS_MXF_SMPTE\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				       const AtmosDescriptor& ADesc, ui32_t HeaderSize)
{
  if ( Info.LabelSetType != LS_MXF_SMPTE )
  {
    DefaultLogSink().Error("Atmos support requires LS_MXF_SMPTE\n");
    return RESULT_FORMAT;
  }

  m_Writer = new h__Writer(&AtmosSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, HeaderSize, ADesc);

  if ( ASDCP_SUCCESS(result) )
      result = m_Writer->SetSourceStream(ADesc, ATMOS_ESSENCE_CODING, ATMOS_PACKAGE_LABEL,
                                         ATMOS_DEF_LABEL);
  
  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}